

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testGroupEnded(TeamCityReporter *this,TestGroupStats *testGroupStats)

{
  ostream *poVar1;
  string local_38;
  TestGroupStats *local_18;
  TestGroupStats *testGroupStats_local;
  TeamCityReporter *this_local;
  
  local_18 = testGroupStats;
  testGroupStats_local = (TestGroupStats *)this;
  StreamingReporterBase::testGroupEnded(&this->super_StreamingReporterBase,testGroupStats);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           "##teamcity[testSuiteFinished name=\'");
  anon_unknown_23::escape(&local_38,(string *)local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TeamCityReporter::testGroupEnded(TestGroupStats const &testGroupStats) {
        StreamingReporterBase::testGroupEnded(testGroupStats);
        stream << "##teamcity[testSuiteFinished name='"
            << escape(testGroupStats.groupInfo.name) << "']\n";
    }